

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O2

void __thiscall OpenMD::Triangle::addVertices(Triangle *this,Vector3d *P1,Vector3d *P2,Vector3d *P3)

{
  Vector<double,_3U> local_40;
  
  Vector<double,_3U>::operator=
            (&this->vertices_[0].super_Vector<double,_3U>,&P1->super_Vector<double,_3U>);
  Vector<double,_3U>::operator=
            (&this->vertices_[1].super_Vector<double,_3U>,&P2->super_Vector<double,_3U>);
  Vector<double,_3U>::operator=
            (&this->vertices_[2].super_Vector<double,_3U>,&P3->super_Vector<double,_3U>);
  operator-(&local_40,&P1->super_Vector<double,_3U>,&P2->super_Vector<double,_3U>);
  Vector3<double>::operator=(&this->a_,&local_40);
  operator-(&local_40,&P1->super_Vector<double,_3U>,&P3->super_Vector<double,_3U>);
  Vector3<double>::operator=(&this->b_,&local_40);
  operator-(&local_40,&P2->super_Vector<double,_3U>,&P3->super_Vector<double,_3U>);
  Vector3<double>::operator=(&this->c_,&local_40);
  return;
}

Assistant:

void Triangle::addVertices(Vector3d P1, Vector3d P2, Vector3d P3) {
  vertices_[0] = P1;
  vertices_[1] = P2;
  vertices_[2] = P3;

  // Compute some quantites like a,b,c
  a_ = P1 - P2;
  b_ = P1 - P3;
  c_ = P2 - P3;
}